

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O3

void jpeg_write_marker(j_compress_ptr cinfo,int marker,JOCTET *dataptr,uint datalen)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  _func_void_j_compress_ptr_int *p_Var3;
  long lVar4;
  
  iVar1 = cinfo->global_state;
  if (cinfo->next_scanline != 0 || 2 < iVar1 - 0x65U) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x15;
    (pjVar2->msg_parm).i[0] = iVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  (*cinfo->marker->write_marker_header)(cinfo,marker,datalen);
  if (datalen != 0) {
    p_Var3 = cinfo->marker->write_marker_byte;
    lVar4 = 0;
    do {
      (*p_Var3)(cinfo,(int)dataptr[lVar4]);
      lVar4 = lVar4 + 1;
    } while (datalen != (uint)lVar4);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_write_marker (j_compress_ptr cinfo, int marker,
		   const JOCTET *dataptr, unsigned int datalen)
{
  JMETHOD(void, write_marker_byte, (j_compress_ptr info, int val));

  if (cinfo->next_scanline != 0 ||
      (cinfo->global_state != CSTATE_SCANNING &&
       cinfo->global_state != CSTATE_RAW_OK &&
       cinfo->global_state != CSTATE_WRCOEFS))
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  (*cinfo->marker->write_marker_header) (cinfo, marker, datalen);
  write_marker_byte = cinfo->marker->write_marker_byte;	/* copy for speed */
  while (datalen--) {
    (*write_marker_byte) (cinfo, *dataptr);
    dataptr++;
  }
}